

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.cc
# Opt level: O3

ostream * std::operator<<(ostream *ofs,matrix3d *m)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ostream *poVar2;
  _anonymous_namespace_ *p_Var3;
  string local_90;
  string local_70;
  string local_50;
  
  std::__ostream_insert<char,std::char_traits<char>>(ofs,"( ",2);
  p_Var3 = (_anonymous_namespace_ *)0x5f18f5;
  std::__ostream_insert<char,std::char_traits<char>>(ofs,"(",1);
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_(&local_50,p_Var3,m->m[0][0]);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (ofs,local_50._M_dataplus._M_p,local_50._M_string_length);
  p_Var3 = (_anonymous_namespace_ *)0x5dc334;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_(&local_90,p_Var3,m->m[0][1]);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_90._M_dataplus._M_p,local_90._M_string_length);
  p_Var3 = (_anonymous_namespace_ *)0x5dc334;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_(&local_70,p_Var3,m->m[0][2]);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_70._M_dataplus._M_p,local_70._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"), ",3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  paVar1 = &local_50.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  p_Var3 = (_anonymous_namespace_ *)0x5f18f5;
  std::__ostream_insert<char,std::char_traits<char>>(ofs,"(",1);
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_(&local_50,p_Var3,m->m[1][0]);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (ofs,local_50._M_dataplus._M_p,local_50._M_string_length);
  p_Var3 = (_anonymous_namespace_ *)0x5dc334;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_(&local_90,p_Var3,m->m[1][1]);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_90._M_dataplus._M_p,local_90._M_string_length);
  p_Var3 = (_anonymous_namespace_ *)0x5dc334;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_(&local_70,p_Var3,m->m[1][2]);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_70._M_dataplus._M_p,local_70._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"), ",3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  p_Var3 = (_anonymous_namespace_ *)0x5f18f5;
  std::__ostream_insert<char,std::char_traits<char>>(ofs,"(",1);
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_(&local_50,p_Var3,m->m[2][0]);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (ofs,local_50._M_dataplus._M_p,local_50._M_string_length);
  p_Var3 = (_anonymous_namespace_ *)0x5dc334;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_(&local_90,p_Var3,m->m[2][1]);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_90._M_dataplus._M_p,local_90._M_string_length);
  p_Var3 = (_anonymous_namespace_ *)0x5dc334;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_(&local_70,p_Var3,m->m[2][2]);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_70._M_dataplus._M_p,local_70._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(ofs," )",2);
  return ofs;
}

Assistant:

std::ostream &operator<<(std::ostream &ofs,
                         const tinyusdz::value::matrix3d &m) {
  ofs << "( ";

  ofs << "(" << tinyusdz::dtos(m.m[0][0]) << ", " << tinyusdz::dtos(m.m[0][1])
      << ", " << tinyusdz::dtos(m.m[0][2]) << "), ";
  ofs << "(" << tinyusdz::dtos(m.m[1][0]) << ", " << tinyusdz::dtos(m.m[1][1])
      << ", " << tinyusdz::dtos(m.m[1][2]) << "), ";
  ofs << "(" << tinyusdz::dtos(m.m[2][0]) << ", " << tinyusdz::dtos(m.m[2][1])
      << ", " << tinyusdz::dtos(m.m[2][2]) << ")";

  ofs << " )";

  return ofs;
}